

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolb.c
# Opt level: O3

int ffpclb(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          uchar *array,int *status)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  double *pdVar7;
  long ngroups;
  long lVar8;
  long ntodo;
  LONGLONG LVar9;
  bool bVar10;
  long incre;
  double zero;
  double scale;
  int tcode;
  int hdutype;
  LONGLONG elemnum;
  long twidth;
  uint local_71a0;
  int maxelem2;
  long local_7198;
  LONGLONG repeat;
  LONGLONG rowlen;
  LONGLONG startpos;
  char cform [20];
  char tform [20];
  LONGLONG tnull;
  char snull [20];
  char message [81];
  double cbuff [3600];
  
  iVar3 = *status;
  if (iVar3 < 1) {
    iVar3 = ffgcprll(fptr,colnum,firstrow,firstelem,nelem,0x11,&scale,&zero,tform,&twidth,&tcode,
                     &maxelem2,&startpos,&elemnum,&incre,&repeat,&rowlen,&hdutype,&tnull,snull,
                     status);
    if (iVar3 < 1) {
      local_71a0 = colnum;
      if (tcode == 0x10) {
        ffcfmt(tform,cform);
      }
      bVar1 = scale != 1.0;
      bVar2 = zero != 0.0;
      bVar10 = tcode != 0xb;
      LVar9 = 0x7fffffff;
      if (nelem < 0x7fffffff) {
        LVar9 = nelem;
      }
      if (bVar10 || (bVar1 || bVar2)) {
        LVar9 = (long)maxelem2;
      }
      if (nelem == 0) {
        iVar3 = *status;
      }
      else {
        local_7198 = 0;
        lVar8 = 0;
LAB_00193ce4:
        lVar6 = LVar9;
        if (nelem < LVar9) {
          lVar6 = nelem;
        }
        ntodo = repeat - elemnum;
        if (lVar6 < repeat - elemnum) {
          ntodo = lVar6;
        }
        ffmbyt(fptr,elemnum * incre + rowlen * local_7198 + startpos,1,status);
        if (tcode < 0x29) {
          if (tcode == 0xb) {
            if (bVar10 || (bVar1 || bVar2)) {
              ffi1fi1(array + lVar8,ntodo,scale,zero,(uchar *)cbuff,status);
              pdVar7 = cbuff;
            }
            else {
              pdVar7 = (double *)(array + lVar8);
            }
            ffpi1b(fptr,ntodo,incre,(uchar *)pdVar7,status);
          }
          else if (tcode == 0x10) {
            sVar4 = strlen(cform);
            pcVar5 = strchr(tform,0x41);
            if (pcVar5 == (char *)0x0) {
              if (((hdutype != 1) || (sVar4 < 2)) ||
                 ((cform[sVar4 - 1] != 'f' && (cform[sVar4 - 1] != 'E')))) goto LAB_0019411e;
              ffi1fstr(array + lVar8,ntodo,scale,zero,cform,twidth,(char *)cbuff,status);
              lVar6 = incre - twidth;
              if (lVar6 != 0) {
                pdVar7 = cbuff;
                ngroups = ntodo;
                goto LAB_0019406d;
              }
              lVar6 = incre * ntodo;
              pdVar7 = cbuff;
            }
            else {
              lVar6 = incre - twidth;
              if (lVar6 != 0) {
                pdVar7 = (double *)(array + lVar8);
                ngroups = ntodo / twidth;
LAB_0019406d:
                ffpbytoff(fptr,twidth,ngroups,lVar6,pdVar7,status);
                goto LAB_00194075;
              }
              pdVar7 = (double *)(array + lVar8);
              lVar6 = ntodo;
            }
            ffpbyt(fptr,lVar6,pdVar7,status);
          }
          else {
            if (tcode != 0x15) {
LAB_0019411e:
              snprintf(message,0x51,"Cannot write numbers to column %d which has format %s",
                       (ulong)local_71a0,tform);
              ffpmsg(message);
              if (hdutype == 1) {
                *status = 0x137;
                return 0x137;
              }
              *status = 0x138;
              return 0x138;
            }
            ffi1fi2(array + lVar8,ntodo,scale,zero,(short *)cbuff,status);
            ffpi2b(fptr,ntodo,incre,(short *)cbuff,status);
          }
        }
        else if (tcode < 0x51) {
          if (tcode == 0x29) {
            ffi1fi4(array + lVar8,ntodo,scale,zero,(int *)cbuff,status);
            ffpi4b(fptr,ntodo,incre,(int *)cbuff,status);
          }
          else {
            if (tcode != 0x2a) goto LAB_0019411e;
            ffi1fr4(array + lVar8,ntodo,scale,zero,(float *)cbuff,status);
            ffpr4b(fptr,ntodo,incre,(float *)cbuff,status);
          }
        }
        else if (tcode == 0x51) {
          ffi1fi8(array + lVar8,ntodo,scale,zero,(LONGLONG *)cbuff,status);
          ffpi8b(fptr,ntodo,incre,(long *)cbuff,status);
        }
        else {
          if (tcode != 0x52) goto LAB_0019411e;
          ffi1fr8(array + lVar8,ntodo,scale,zero,cbuff,status);
          ffpr8b(fptr,ntodo,incre,cbuff,status);
        }
LAB_00194075:
        iVar3 = *status;
        if (0 < iVar3) {
          snprintf(message,0x51,
                   "Error writing elements %.0f thru %.0f of input data array (ffpclb).",
                   (double)(lVar8 + 1),(double)(ntodo + lVar8));
          ffpmsg(message);
          return *status;
        }
        nelem = nelem - ntodo;
        if (nelem != 0) {
          lVar8 = lVar8 + ntodo;
          elemnum = ntodo + elemnum;
          if (elemnum == repeat) {
            elemnum = 0;
            local_7198 = local_7198 + 1;
          }
          goto LAB_00193ce4;
        }
      }
      if (iVar3 == -0xb) {
        ffpmsg("Numerical overflow during type conversion while writing FITS data.");
        *status = 0x19c;
        iVar3 = 0x19c;
      }
    }
    else {
      iVar3 = *status;
    }
  }
  return iVar3;
}

Assistant:

int ffpclb( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            unsigned char *array, /* I - array of values to write           */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer to a virtual column in a 1 or more grouped FITS primary
  array.  FITSIO treats a primary array as a binary table with
  2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The input array of values will be converted to the datatype of the column 
  and will be inverse-scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    int writemode;
    int tcode, maxelem2, hdutype, writeraw;
    long twidth, incre;
    long  ntodo;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, tnull, maxelem;
    double scale, zero;
    char tform[20], cform[20];
    char message[FLEN_ERRMSG];
    size_t formlen;

    char snull[20];   /*  the FITS null value  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/

    /* IMPORTANT NOTE: that the special case of using this subroutine
       to write bytes to a character column are handled internally
       by the call to ffgcprll() below.  It will adjust the effective
       *tcode, repeats, etc, to appear as a TBYTE column. */

    writemode = 17; /* Equivalent to writemode = 1 but allow TSTRING -> TBYTE */

    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, writemode, &scale, &zero,
        tform, &twidth, &tcode, &maxelem2, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);
    maxelem = maxelem2;

    if (tcode == TSTRING)   
         ffcfmt(tform, cform);     /* derive C format for writing strings */

    /*
      if there is no scaling 
      then we can simply write the raw data bytes into the FITS file if the
      datatype of the FITS column is the same as the input values.  Otherwise,
      we must convert the raw values into the scaled and/or machine dependent
      format in a temporary buffer that has been allocated for this purpose.
    */
    if (scale == 1. && zero == 0. && tcode == TBYTE)
    {
        writeraw = 1;
        if (nelem < (LONGLONG)INT32_MAX) {
            maxelem = nelem;
        } else {
            maxelem = INT32_MAX;
        }
     }
    else
        writeraw = 0;

    /*---------------------------------------------------------------------*/
    /*  Now write the pixels to the FITS column.                           */
    /*  First call the ffXXfYY routine to  (1) convert the datatype        */
    /*  if necessary, and (2) scale the values by the FITS TSCALn and      */
    /*  TZEROn linear scaling parameters into a temporary buffer.          */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to write  */
    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
        /* limit the number of pixels to process a one time to the number that
           will fit in the buffer space or to the number of pixels that remain
           in the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);      
        ntodo = (long) minvalue(ntodo, (repeat - elemnum));

        wrtptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);
        ffmbyt(fptr, wrtptr, IGNORE_EOF, status); /* move to write position */

        switch (tcode) 
        {
            case (TBYTE):
              if (writeraw)
              {
                /* write raw input bytes without conversion */
                ffpi1b(fptr, ntodo, incre, &array[next], status);
              }
              else
              {
                /* convert the raw data before writing to FITS file */
                ffi1fi1(&array[next], ntodo, scale, zero,
                        (unsigned char *) buffer, status);
                ffpi1b(fptr, ntodo, incre, (unsigned char *) buffer, status);
              }

              break;

            case (TLONGLONG):

                ffi1fi8(&array[next], ntodo, scale, zero,
                        (LONGLONG *) buffer, status);
                ffpi8b(fptr, ntodo, incre, (long *) buffer, status);
                break;

            case (TSHORT):
 
                ffi1fi2(&array[next], ntodo, scale, zero,
                        (short *) buffer, status);
                ffpi2b(fptr, ntodo, incre, (short *) buffer, status);
                break;

            case (TLONG):

                ffi1fi4(&array[next], ntodo, scale, zero,
                        (INT32BIT *) buffer, status);
                ffpi4b(fptr, ntodo, incre, (INT32BIT *) buffer, status);
                break;

            case (TFLOAT):

                ffi1fr4(&array[next], ntodo, scale, zero,
                        (float *)  buffer, status);
                ffpr4b(fptr, ntodo, incre, (float *) buffer, status);
                break;

            case (TDOUBLE):
                ffi1fr8(&array[next], ntodo, scale, zero,
                        (double *) buffer, status);
                ffpr8b(fptr, ntodo, incre, (double *) buffer, status);
                break;

            case (TSTRING):  /* numerical column in an ASCII table */

                formlen = strlen(cform);
	        if (strchr(tform,'A')) 
                {
                    /* write raw input bytes without conversion        */
                    /* This case is a hack to let users write a stream */
                    /* of bytes directly to the 'A' format column      */

		  if (incre == twidth) {
                        ffpbyt(fptr, ntodo, &array[next], status);
		  } else {
                        ffpbytoff(fptr, twidth, ntodo/twidth, incre - twidth, 
                                &array[next], status);
		  }
		  break;
                }
                else if (hdutype == ASCII_TBL && formlen > 1)
                {
                   if (cform[formlen-1] == 'f' || cform[formlen-1] == 'E')
                   {
                     ffi1fstr(&array[next], ntodo, scale, zero, cform,
                             twidth, (char *) buffer, status);

                     if (incre == twidth)    /* contiguous bytes */
                        ffpbyt(fptr, ntodo * twidth, buffer, status);
                     else
                        ffpbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);
                     break;
                   }
                }
                /* can't write to string column, so fall thru to default: */

            default:  /*  error trap  */
                snprintf(message, FLEN_ERRMSG,
                       "Cannot write numbers to column %d which has format %s",
                        colnum,tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous write operation */
        {
          snprintf(message,FLEN_ERRMSG,
          "Error writing elements %.0f thru %.0f of input data array (ffpclb).",
              (double) (next+1), (double) (next+ntodo));
          ffpmsg(message);
          return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum += ntodo;
            if (elemnum == repeat)  /* completed a row; start on next row */
            {
                elemnum = 0;
                rownum++;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
      ffpmsg(
      "Numerical overflow during type conversion while writing FITS data.");
      *status = NUM_OVERFLOW;
    }

    return(*status);
}